

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_client.cc
# Opt level: O2

bool bssl::tls13_process_new_session_ticket(SSL *ssl,SSLMessage *msg)

{
  ssl_ctx_st *psVar1;
  _func_int_SSL_ptr_SSL_SESSION_ptr *p_Var2;
  int iVar3;
  bool bVar4;
  UniquePtr<SSL_SESSION> session;
  CBS body;
  _Head_base<0UL,_ssl_session_st_*,_false> local_30;
  _Head_base<0UL,_bssl::SSL_CONFIG_*,_false> local_28;
  size_t sStack_20;
  
  bVar4 = true;
  if (ssl->s3->write_shutdown == ssl_shutdown_none) {
    local_28._M_head_impl = (SSL_CONFIG *)(msg->body).data;
    sStack_20 = (msg->body).len;
    tls13_create_session_with_ticket((SSL *)&stack0xffffffffffffffd0,(CBS *)ssl);
    bVar4 = local_30._M_head_impl != (ssl_session_st *)0x0;
    if (((bVar4) &&
        (psVar1 = (ssl->session_ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>
                  ._M_t.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
        (psVar1->session_cache_mode & 1) != 0)) &&
       (p_Var2 = psVar1->new_session_cb, p_Var2 != (_func_int_SSL_ptr_SSL_SESSION_ptr *)0x0)) {
      iVar3 = (*p_Var2)(ssl,local_30._M_head_impl);
      if (iVar3 != 0) {
        local_30._M_head_impl = (ssl_session_st *)0x0;
      }
    }
    std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&stack0xffffffffffffffd0);
  }
  return bVar4;
}

Assistant:

bool tls13_process_new_session_ticket(SSL *ssl, const SSLMessage &msg) {
  if (ssl->s3->write_shutdown != ssl_shutdown_none) {
    // Ignore tickets on shutdown. Callers tend to indiscriminately call
    // |SSL_shutdown| before destroying an |SSL|, at which point calling the new
    // session callback may be confusing.
    return true;
  }

  CBS body = msg.body;
  UniquePtr<SSL_SESSION> session = tls13_create_session_with_ticket(ssl, &body);
  if (!session) {
    return false;
  }

  if ((ssl->session_ctx->session_cache_mode & SSL_SESS_CACHE_CLIENT) &&
      ssl->session_ctx->new_session_cb != NULL &&
      ssl->session_ctx->new_session_cb(ssl, session.get())) {
    // |new_session_cb|'s return value signals that it took ownership.
    session.release();
  }

  return true;
}